

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::AssignOp::~AssignOp(AssignOp *this)

{
  pointer pSVar1;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_021d15f0;
  if (this->m_lvalueExpr != (Expression *)0x0) {
    (*this->m_lvalueExpr->_vptr_Expression[1])();
  }
  if (this->m_rvalueExpr != (Expression *)0x0) {
    (*this->m_rvalueExpr->_vptr_Expression[1])();
  }
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  ValueRange::~ValueRange(&this->m_valueRange);
  return;
}

Assistant:

AssignOp::~AssignOp (void)
{
	delete m_lvalueExpr;
	delete m_rvalueExpr;
}